

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_LzFind.cpp
# Opt level: O2

UInt32 crnlib::Bt2_MatchFinder_GetMatches(CMatchFinder *p,UInt32 *distances)

{
  uint lenLimit;
  UInt32 UVar1;
  UInt32 *pUVar2;
  UInt32 UVar3;
  
  lenLimit = p->lenLimit;
  if (lenLimit < 2) {
    MatchFinder_MovePos(p);
    UVar3 = 0;
  }
  else {
    UVar1 = p->hash[*(ushort *)p->buffer];
    UVar3 = p->pos;
    p->hash[*(ushort *)p->buffer] = UVar3;
    pUVar2 = GetMatchesSpec1(lenLimit,UVar1,UVar3,p->buffer,p->son,p->cyclicBufferPos,
                             p->cyclicBufferSize,p->cutValue,distances,1);
    UVar3 = (UInt32)((ulong)((long)pUVar2 - (long)distances) >> 2);
    p->cyclicBufferPos = p->cyclicBufferPos + 1;
    p->buffer = p->buffer + 1;
    UVar1 = p->pos + 1;
    p->pos = UVar1;
    if (UVar1 == p->posLimit) {
      MatchFinder_CheckLimits(p);
    }
  }
  return UVar3;
}

Assistant:

static UInt32 Bt2_MatchFinder_GetMatches(CMatchFinder* p, UInt32* distances) {
  UInt32 offset;
  GET_MATCHES_HEADER(2)
  HASH2_CALC;
  curMatch = p->hash[hashValue];
  p->hash[hashValue] = p->pos;
  offset = 0;
  GET_MATCHES_FOOTER(offset, 1)
}